

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnJoin(RenX_LoggingPlugin *this,Server *server,PlayerInfo *player)

{
  bool bVar1;
  byte bVar2;
  __sv_type _Var3;
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  undefined1 local_40 [8];
  string msg;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  
  msg.field_2._8_8_ = player;
  std::__cxx11::string::string((string *)local_40);
  if ((*(ulong *)&this->field_0xa0 >> 3 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               &this->joinPublicFmt);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
    if (!bVar1) {
      RenX::processTags((string *)local_40,server,(PlayerInfo *)msg.field_2._8_8_,(PlayerInfo *)0x0,
                        (BuildingInfo *)0x0);
      _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
      local_60 = _Var3._M_len;
      local_58 = _Var3._M_str;
      RenX::Server::sendPubChan(server,local_60,local_58);
    }
  }
  if (*(long *)(msg.field_2._8_8_ + 0xe8) == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               &this->joinNoSteamAdminFmt);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               &this->joinAdminFmt);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  if ((!bVar1) && (bVar2 = RenX::Server::isMatchPending(), (bVar2 & 1) == 0)) {
    RenX::processTags((string *)local_40,server,(PlayerInfo *)msg.field_2._8_8_,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
    local_70 = _Var3._M_len;
    local_68 = _Var3._M_str;
    RenX::Server::sendAdmChan(server,local_70,local_68);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnJoin(RenX::Server &server, const RenX::PlayerInfo &player)
{
	std::string msg;
	if (RenX_LoggingPlugin::joinPublic)
	{
		msg = this->joinPublicFmt;
		if (!msg.empty())
		{
			RenX::processTags(msg, &server, &player);
			server.sendPubChan(msg);
		}
	}
	if (player.steamid == 0)
		msg = this->joinNoSteamAdminFmt;
	else
		msg = this->joinAdminFmt;

	if (!msg.empty() && server.isMatchPending() == false)
	{
		RenX::processTags(msg, &server, &player);
		server.sendAdmChan(msg);
	}
}